

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderMatrixTests.cpp
# Opt level: O1

void deqp::gles3::Functional::MatrixCaseUtils::Evaluator<2,_3,_9>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  undefined8 uVar1;
  float *pfVar2;
  Vector<float,_3> *pVVar3;
  int col_1;
  long lVar4;
  undefined4 *puVar5;
  long lVar6;
  long lVar7;
  float *pfVar8;
  int col;
  float v;
  float fVar9;
  undefined4 uVar10;
  Type in0;
  Vector<float,_3> res;
  Type in1;
  Vec4 *local_18;
  int local_10 [4];
  
  if (in0Type == INPUTTYPE_DYNAMIC) {
    in0.m_data._0_8_ = *(undefined8 *)(evalCtx->coords).m_data;
    in0.m_data[2] = (evalCtx->coords).m_data[2];
  }
  else {
    in0.m_data[0] = 1.1;
    in0.m_data[1] = 0.1;
    in0.m_data[2] = 0.5;
  }
  pfVar2 = (float *)&in1;
  if (in1Type == INPUTTYPE_DYNAMIC) {
    lVar4 = 0;
    lVar6 = 0;
    do {
      lVar7 = 0;
      do {
        uVar10 = 0x3f800000;
        if (lVar4 != lVar7) {
          uVar10 = 0;
        }
        *(undefined4 *)((long)pfVar2 + lVar7) = uVar10;
        lVar7 = lVar7 + 0xc;
      } while (lVar7 != 0x24);
      lVar6 = lVar6 + 1;
      pfVar2 = pfVar2 + 1;
      lVar4 = lVar4 + 0xc;
    } while (lVar6 != 3);
    in1.m_data.m_data[0].m_data._0_8_ = *(undefined8 *)evalCtx->in[0].m_data;
    in1.m_data.m_data[0].m_data[2] = evalCtx->in[0].m_data[2];
    uVar1 = *(undefined8 *)evalCtx->in[1].m_data;
    in1.m_data.m_data[1].m_data[0] = (float)uVar1;
    in1.m_data.m_data[1].m_data[1] = (float)((ulong)uVar1 >> 0x20);
    in1.m_data.m_data[1].m_data[2] = evalCtx->in[1].m_data[2];
    in1.m_data.m_data[2].m_data._0_8_ = *(undefined8 *)evalCtx->in[2].m_data;
    in1.m_data.m_data[2].m_data[2] = evalCtx->in[2].m_data[2];
  }
  else {
    in1.m_data.m_data[1].m_data[1] = 0.0;
    in1.m_data.m_data[1].m_data[2] = 0.0;
    in1.m_data.m_data[2].m_data[0] = 0.0;
    in1.m_data.m_data[2].m_data[1] = 0.0;
    in1.m_data.m_data[0].m_data[0] = 0.0;
    in1.m_data.m_data[0].m_data[1] = 0.0;
    in1.m_data.m_data[0].m_data[2] = 0.0;
    in1.m_data.m_data[1].m_data[0] = 0.0;
    in1.m_data.m_data[2].m_data[2] = 0.0;
    puVar5 = &DAT_01c2e184;
    lVar4 = 0;
    do {
      lVar6 = 0;
      pfVar8 = pfVar2;
      do {
        *pfVar8 = (float)puVar5[lVar6];
        lVar6 = lVar6 + 1;
        pfVar8 = pfVar8 + 3;
      } while (lVar6 != 3);
      lVar4 = lVar4 + 1;
      pfVar2 = pfVar2 + 1;
      puVar5 = puVar5 + 3;
    } while (lVar4 != 3);
  }
  res.m_data[2] = 0.0;
  res.m_data[0] = 0.0;
  res.m_data[1] = 0.0;
  pVVar3 = (Vector<float,_3> *)&in1;
  lVar4 = 0;
  do {
    fVar9 = 0.0;
    lVar6 = 0;
    do {
      fVar9 = fVar9 + ((Vector<tcu::Vector<float,_3>,_3> *)pVVar3->m_data)->m_data[0].m_data[lVar6]
                      * in0.m_data[lVar6];
      lVar6 = lVar6 + 1;
    } while (lVar6 != 3);
    res.m_data[lVar4] = fVar9;
    lVar4 = lVar4 + 1;
    pVVar3 = pVVar3 + 1;
  } while (lVar4 != 3);
  local_18 = &evalCtx->color;
  local_10[0] = 0;
  local_10[1] = 1;
  local_10[2] = 2;
  lVar4 = 2;
  do {
    (evalCtx->color).m_data[*(int *)((long)&local_18 + lVar4 * 4)] = in0.m_data[lVar4 + 2];
    lVar4 = lVar4 + 1;
  } while (lVar4 != 5);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);
		typename TypeTraits<In1DataType>::Type	in1	= (in1Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In1DataType>(evalCtx, 1)
																				     : getInputValue<INPUTTYPE_CONST,	In1DataType>(evalCtx, 1);
		evalCtx.color.xyz() = reduceToVec3(in0 * in1);
	}